

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Sprs_array_column_distribution64(int s_a,int iproc,int64_t *lo,int64_t *hi)

{
  Integer *in_RCX;
  Integer *in_RDX;
  int in_ESI;
  int in_EDI;
  Integer ihi;
  Integer ilo;
  Integer ip;
  Integer sa;
  Integer local_38;
  Integer local_30;
  long local_28;
  long local_20;
  Integer *local_18;
  Integer *local_10;
  
  local_20 = (long)in_EDI;
  local_28 = (long)in_ESI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  pnga_sprs_array_column_distribution(local_20,local_28,&local_30,&local_38);
  *local_10 = local_30;
  *local_18 = local_38;
  return;
}

Assistant:

void NGA_Sprs_array_column_distribution64(int s_a, int iproc, int64_t *lo, int64_t *hi)
{
  Integer sa = (Integer)s_a;
  Integer ip = (Integer)iproc;
  Integer ilo, ihi;
  wnga_sprs_array_column_distribution(sa,ip,&ilo,&ihi);
  *lo = (int64_t)ilo;
  *hi = (int64_t)ihi;
}